

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
 __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::
insert_node_<true,false,true,Gudhi::Vector_filtration_value_const&>
          (Simplex_tree<Simplex_tree_vec_fil> *this,Siblings *sib,Vertex_handle v,
          Vector_filtration_value *filtration_value)

{
  bool bVar1;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  Vector_filtration_value *in_R8;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_false>,_bool>
  pVar3;
  undefined4 local_1c;
  pointer local_18;
  undefined8 uVar2;
  
  local_18 = (pointer)CONCAT44(in_register_00000014,v);
  local_1c = SUB84(filtration_value,0);
  pVar3 = boost::container::
          flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>,std::less<int>,void>
          ::
          try_emplace<Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>,std::less<int>,void>>*&,Gudhi::Vector_filtration_value_const&>
                    ((flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>>,std::less<int>,void>
                      *)this,local_18 + 4,
                     (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_vec_fil>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>,_std::less<int>,_void>_>
                      **)&local_1c,(Vector_filtration_value *)&local_18);
  uVar2 = pVar3._8_8_;
  if ((char)(this->nodes_label_to_list_)._M_h._M_bucket_count == '\0') {
    bVar1 = unify_lifetimes((Vector_filtration_value *)
                            ((this->nodes_label_to_list_)._M_h._M_buckets + 1),in_R8);
    uVar2 = extraout_RDX;
    if (!bVar1) {
      (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    }
  }
  pVar3._8_8_ = uVar2;
  pVar3.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
        *)this;
  return pVar3;
}

Assistant:

std::pair<Dictionary_it, bool> insert_node_(Siblings *sib, Vertex_handle v, Filt&& filtration_value) {
    std::pair<Dictionary_it, bool> ins = sib->members_.try_emplace(v, sib, std::forward<Filt>(filtration_value));

    if constexpr (update_children){
      if (!(has_children(ins.first))) {
        ins.first->second.assign_children(new Siblings(sib, v));
      }
    }

    if (ins.second){
      // Only required when insertion is successful
      update_simplex_tree_after_node_insertion(ins.first);
      return ins;
    }

    if constexpr (Options::store_filtration && update_fil){
      if (unify_lifetimes(ins.first->second.filtration(), filtration_value)) return ins;
    }

    if constexpr (set_to_null){
      ins.first = Dictionary_it();
    }

    return ins;
  }